

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::addedRows(SPxBasisBase<double> *this,int n)

{
  SPxId *pSVar1;
  Status SVar2;
  int iVar3;
  uint uVar4;
  DataKey DVar6;
  ostream *poVar7;
  SPxInternalCodeException *this_00;
  long lVar8;
  allocator local_39;
  string local_38;
  SPxStatus SVar5;
  
  if (0 < n) {
    reDim(this);
    iVar3 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    if (this->theLP->theRep == COLUMN) {
      for (lVar8 = (long)(iVar3 - n); lVar8 < iVar3; lVar8 = lVar8 + 1) {
        SVar2 = dualRowStatus(this,(int)lVar8);
        (this->thedesc).rowstat.data[lVar8] = SVar2;
        DVar6 = (DataKey)SPxLPBase<double>::rId(&this->theLP->super_SPxLPBase<double>,(int)lVar8);
        pSVar1 = (this->theBaseId).data;
        pSVar1[lVar8].super_DataKey = DVar6;
        pSVar1[lVar8].super_DataKey.info = -1;
        iVar3 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                super_SVSetBase<double>.set.thenum;
      }
    }
    else {
      for (lVar8 = (long)(iVar3 - n); lVar8 < iVar3; lVar8 = lVar8 + 1) {
        SVar2 = dualRowStatus(this,(int)lVar8);
        (this->thedesc).rowstat.data[lVar8] = SVar2;
        iVar3 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                super_SVSetBase<double>.set.thenum;
      }
    }
    SVar5 = this->thestatus;
    if ((NO_PROBLEM < SVar5) && (this->matrixIsSetup == true)) {
      loadMatrixVecs(this);
      SVar5 = this->thestatus;
    }
    uVar4 = SVar5 + PRIMAL;
    if (7 < uVar4) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"ECHBAS04 Unknown basis status!");
      std::endl<char,std::char_traits<char>>(poVar7);
      this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_38,"XCHBAS01 This should never happen.",&local_39);
      SPxInternalCodeException::SPxInternalCodeException(this_00,&local_38);
      __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if ((0xfU >> (uVar4 & 0x1f) & 1) == 0) {
      this->thestatus = (uint)((0x50U >> (uVar4 & 0x1f) & 1) == 0);
    }
  }
  return;
}

Assistant:

void SPxBasisBase<R>::addedRows(int n)
{
   assert(theLP != nullptr);

   if(n > 0)
   {
      reDim();

      if(theLP->rep() == SPxSolverBase<R>::COLUMN)
      {
         /* after adding rows in column representation, reDim() should set these bools to false. */
         assert(!matrixIsSetup && !factorized);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
         {
            thedesc.rowStatus(i) = dualRowStatus(i);
            baseId(i) = theLP->SPxLPBase<R>::rId(i);
         }
      }
      else
      {
         assert(theLP->rep() == SPxSolverBase<R>::ROW);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
            thedesc.rowStatus(i) = dualRowStatus(i);
      }

      /* If matrix was set up, load new basis vectors to the matrix.
       * In the row case, the basis is not effected by adding rows. However,
       * since @c matrix stores references to the rows in the LP (SPxLPBase<R>), a realloc
       * in SPxLPBase<R> (e.g. due to space requirements) might invalidate these references.
       * We therefore have to "reload" the matrix if it is set up. Note that reDim()
       * leaves @c matrixIsSetup untouched if only row have been added, since the basis
       * matrix already has the correct size. */
      if(status() > NO_PROBLEM && matrixIsSetup)
         loadMatrixVecs();

      /* update basis status */
      switch(status())
      {
      case PRIMAL:
      case UNBOUNDED:
         setStatus(REGULAR);
         break;

      case OPTIMAL:
      case INFEASIBLE:
         setStatus(DUAL);
         break;

      case NO_PROBLEM:
      case SINGULAR:
      case REGULAR:
      case DUAL:
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ECHBAS04 Unknown basis status!" << std::endl;)
         throw SPxInternalCodeException("XCHBAS01 This should never happen.");
      }
   }
}